

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

LPWSTR LOADGetModuleFileName(MODSTRUCT *module)

{
  LPWSTR module_name;
  MODSTRUCT *module_local;
  
  if (module == (MODSTRUCT *)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    module_local = (MODSTRUCT *)exe_module.lib_name;
  }
  else {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    module_local = (MODSTRUCT *)module->lib_name;
  }
  return (LPWSTR)module_local;
}

Assistant:

static LPWSTR LOADGetModuleFileName(MODSTRUCT *module)
{
    LPWSTR module_name;
    /* special case : if module is NULL, we want the name of the executable */
    if (!module)
    {
        module_name = exe_module.lib_name;
        TRACE("Returning name of main executable\n");
        return module_name;
    }

    /* return "real" name of module if it is known. we have this if LoadLibrary
       was given an absolute or relative path; we can also determine it at the
       first GetProcAddress call. */
    TRACE("Returning full path name of module\n");
    return module->lib_name;
}